

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackBoolVectorToFlatIndexList(ImBoolVector *in,ImVector<int> *out)

{
  uint *puVar1;
  uint *puVar2;
  ImVector<int> *in_RDI;
  int bit_n;
  int entries_32;
  int *it;
  int *it_end;
  int *it_begin;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  uint uVar4;
  uint *local_28;
  
  puVar1 = (uint *)ImVector<int>::begin(in_RDI);
  puVar2 = (uint *)ImVector<int>::end(in_RDI);
  for (local_28 = puVar1; local_28 < puVar2; local_28 = local_28 + 1) {
    uVar4 = *local_28;
    if (uVar4 != 0) {
      for (iVar3 = 0; iVar3 < 0x20; iVar3 = iVar3 + 1) {
        if ((uVar4 & 1 << ((byte)iVar3 & 0x1f)) != 0) {
          ImVector<int>::push_back
                    ((ImVector<int> *)CONCAT44(uVar4,iVar3),
                     (int *)CONCAT44((int)(((long)local_28 - (long)puVar1 >> 2) << 5) + iVar3,
                                     in_stack_ffffffffffffffc8));
        }
      }
    }
  }
  return;
}

Assistant:

static void UnpackBoolVectorToFlatIndexList(const ImBoolVector* in, ImVector<int>* out)
{
    IM_ASSERT(sizeof(in->Storage.Data[0]) == sizeof(int));
    const int* it_begin = in->Storage.begin();
    const int* it_end = in->Storage.end();
    for (const int* it = it_begin; it < it_end; it++)
        if (int entries_32 = *it)
            for (int bit_n = 0; bit_n < 32; bit_n++)
                if (entries_32 & (1 << bit_n))
                    out->push_back((int)((it - it_begin) << 5) + bit_n);
}